

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::DeprecatedFree(ART *art,Node *node)

{
  Leaf *pLVar1;
  FixedSizeAllocator *this;
  IndexPointer ptr;
  
  ptr.data = (node->super_IndexPointer).data;
  while (ptr.data >> 0x38 != 0) {
    pLVar1 = Node::Ref<duckdb::Leaf>(art,(Node)ptr.data,LEAF);
    ptr.data = (pLVar1->ptr).super_IndexPointer.data;
    this = Node::GetAllocator(art,LEAF);
    FixedSizeAllocator::Free(this,(IndexPointer)(node->super_IndexPointer).data);
    (node->super_IndexPointer).data = ptr.data;
  }
  (node->super_IndexPointer).data = 0;
  return;
}

Assistant:

void Leaf::DeprecatedFree(ART &art, Node &node) {
	D_ASSERT(node.GetType() == LEAF);

	Node next;
	while (node.HasMetadata()) {
		next = Node::Ref<Leaf>(art, node, LEAF).ptr;
		Node::GetAllocator(art, LEAF).Free(node);
		node = next;
	}
	node.Clear();
}